

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::log<char_const(&)[69],kj::String&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [69],
               String *params_1)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  String *params_00;
  long lVar3;
  String argValues [2];
  ArrayPtr<kj::String> in_stack_ffffffffffffff98;
  undefined8 uStack_58;
  String local_50;
  
  str<char_const(&)[69]>
            ((String *)&stack0xffffffffffffff98,(kj *)params,
             (char (*) [69])CONCAT44(in_register_00000014,severity));
  str<kj::String&>(&local_50,(kj *)params_1,params_00);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffff98,in_stack_ffffffffffffff98);
  lVar3 = 0x18;
  do {
    lVar1 = *(long *)(&stack0xffffffffffffff98 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(&stack0xffffffffffffffa0 + lVar3);
      *(undefined8 *)(&stack0xffffffffffffff98 + lVar3) = 0;
      *(undefined8 *)(&stack0xffffffffffffffa0 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&uStack_58 + lVar3))
                (*(undefined8 **)((long)&uStack_58 + lVar3),lVar1,1,uVar2,uVar2,0);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}